

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_3e58a::updateNames::NameMapper::~NameMapper(NameMapper *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
           ).super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.
           super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::Task,_std::allocator<wasm::Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
                                          ).
                                          super_PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                                          .
                                          super_Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::Task,_std::allocator<wasm::Walker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  wasm::Pass::~Pass((Pass *)this);
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }